

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

Operand * __thiscall IrSim::newVar(Operand *__return_storage_ptr__,IrSim *this)

{
  int __val;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = this->varSeq;
  this->varSeq = __val + 1;
  std::__cxx11::to_string(&sStack_58,__val);
  std::operator+(&local_38,&this->VarPrefix,&sStack_58);
  Operand::Operand(__return_storage_ptr__,1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return __return_storage_ptr__;
}

Assistant:

Operand newVar()    { return Operand(OP_VARIABLE, VarPrefix    + to_string(varSeq++)); }